

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void FindHoveredWindow(void)

{
  ImGuiStyle *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec2 *pIVar4;
  ImGuiWindow *local_68;
  undefined1 local_50 [8];
  ImRect bb;
  ImGuiWindow *window;
  int i;
  ImVec2 local_28;
  ImVec2 padding_for_resize_from_edges;
  ImVec2 padding_regular;
  ImGuiWindow *hovered_window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  padding_regular.x = 0.0;
  padding_regular.y = 0.0;
  if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) && ((GImGui->MovingWindow->Flags & 0x200U) == 0))
  {
    padding_regular = (ImVec2)GImGui->MovingWindow;
  }
  local_28 = (GImGui->Style).TouchExtraPadding;
  padding_for_resize_from_edges = local_28;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges & 1U) != 0) {
    pIVar1 = &GImGui->Style;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,4.0,4.0);
    local_28 = ImMax(&pIVar1->TouchExtraPadding,(ImVec2 *)&stack0xffffffffffffffd0);
  }
  window._4_4_ = (pIVar2->Windows).Size;
  do {
    do {
      do {
        window._4_4_ = window._4_4_ + -1;
        if (window._4_4_ < 0) goto LAB_0024726e;
        pIVar4 = (ImVec2 *)ImVector<ImGuiWindow_*>::operator[](&pIVar2->Windows,window._4_4_);
        bb.Max = *pIVar4;
      } while ((((*(bool *)((long)bb.Max + 0x7e) & 1U) == 0) ||
               ((*(bool *)((long)bb.Max + 0x85) & 1U) != 0)) ||
              ((*(ImGuiWindowFlags *)((long)bb.Max + 0xc) & 0x200U) != 0));
      local_50 = *(undefined1 (*) [8])((long)bb.Max + 0x218);
      bb.Min = *(ImVec2 *)((long)bb.Max + 0x220);
      if ((*(ImGuiWindowFlags *)((long)bb.Max + 0xc) & 0x1000042U) == 0) {
        ImRect::Expand((ImRect *)local_50,&local_28);
      }
      else {
        ImRect::Expand((ImRect *)local_50,&padding_for_resize_from_edges);
      }
      bVar3 = ImRect::Contains((ImRect *)local_50,&(pIVar2->IO).MousePos);
    } while (!bVar3);
    if (padding_regular == (ImVec2)0x0) {
      padding_regular = bb.Max;
    }
  } while (padding_regular == (ImVec2)0x0);
LAB_0024726e:
  pIVar2->HoveredWindow = (ImGuiWindow *)padding_regular;
  if (pIVar2->HoveredWindow == (ImGuiWindow *)0x0) {
    local_68 = (ImGuiWindow *)0x0;
  }
  else {
    local_68 = pIVar2->HoveredWindow->RootWindow;
  }
  pIVar2->HoveredRootWindow = local_68;
  return;
}

Assistant:

static void FindHoveredWindow()
{
    ImGuiContext& g = *GImGui;

    ImGuiWindow* hovered_window = NULL;
    if (g.MovingWindow && !(g.MovingWindow->Flags & ImGuiWindowFlags_NoMouseInputs))
        hovered_window = g.MovingWindow;

    ImVec2 padding_regular = g.Style.TouchExtraPadding;
    ImVec2 padding_for_resize_from_edges = g.IO.ConfigWindowsResizeFromEdges ? ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS, WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS)) : padding_regular;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        if (!window->Active || window->Hidden)
            continue;
        if (window->Flags & ImGuiWindowFlags_NoMouseInputs)
            continue;

        // Using the clipped AABB, a child window will typically be clipped by its parent (not always)
        ImRect bb(window->OuterRectClipped);
        if (window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_AlwaysAutoResize))
            bb.Expand(padding_regular);
        else
            bb.Expand(padding_for_resize_from_edges);
        if (!bb.Contains(g.IO.MousePos))
            continue;

        // Those seemingly unnecessary extra tests are because the code here is a little different in viewport/docking branches.
        if (hovered_window == NULL)
            hovered_window = window;
        if (hovered_window)
            break;
    }

    g.HoveredWindow = hovered_window;
    g.HoveredRootWindow = g.HoveredWindow ? g.HoveredWindow->RootWindow : NULL;

}